

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableBeginRow(ImGuiTable *table)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiTable *pIVar4;
  ImU32 IVar5;
  ImU32 IVar6;
  float fVar7;
  
  pIVar3 = table->InnerWindow;
  table->CurrentColumn = -1;
  piVar1 = &table->CurrentRow;
  *piVar1 = *piVar1 + 1;
  iVar2 = *piVar1;
  table->RowBgColor[0] = 0x1000000;
  table->RowBgColor[1] = 0x1000000;
  table->RowCellDataCurrent = -1;
  table->IsInsideRow = true;
  fVar7 = table->RowPosY2;
  if ((iVar2 == 0) && ('\0' < table->FreezeRowsCount)) {
    fVar7 = (table->OuterRect).Min.y;
    (pIVar3->DC).CursorPos.y = fVar7;
  }
  table->RowPosY2 = fVar7;
  table->RowPosY1 = fVar7;
  table->RowTextBaseline = 0.0;
  table->RowIndentOffsetX = (pIVar3->DC).Indent.x - table->HostIndentX;
  (pIVar3->DC).PrevLineTextBaseOffset = 0.0;
  (pIVar3->DC).CursorMaxPos.y = fVar7;
  if ((table->field_0x98 & 1) != 0) {
    IVar5 = GetColorU32(0x2a,1.0);
    pIVar4 = GImGui->CurrentTable;
    if (pIVar4->RowPosY1 <= (pIVar4->InnerClipRect).Max.y) {
      IVar6 = 0;
      if (IVar5 != 0x1000000) {
        IVar6 = IVar5;
      }
      pIVar4->RowBgColor[0] = IVar6;
    }
    if (table->CurrentRow == 0) {
      table->IsUsingHeaders = true;
    }
  }
  return;
}

Assistant:

void ImGui::TableBeginRow(ImGuiTable* table)
{
    ImGuiWindow* window = table->InnerWindow;
    IM_ASSERT(!table->IsInsideRow);

    // New row
    table->CurrentRow++;
    table->CurrentColumn = -1;
    table->RowBgColor[0] = table->RowBgColor[1] = IM_COL32_DISABLE;
    table->RowCellDataCurrent = -1;
    table->IsInsideRow = true;

    // Begin frozen rows
    float next_y1 = table->RowPosY2;
    if (table->CurrentRow == 0 && table->FreezeRowsCount > 0)
        next_y1 = window->DC.CursorPos.y = table->OuterRect.Min.y;

    table->RowPosY1 = table->RowPosY2 = next_y1;
    table->RowTextBaseline = 0.0f;
    table->RowIndentOffsetX = window->DC.Indent.x - table->HostIndentX; // Lock indent
    window->DC.PrevLineTextBaseOffset = 0.0f;
    window->DC.CursorMaxPos.y = next_y1;

    // Making the header BG color non-transparent will allow us to overlay it multiple times when handling smooth dragging.
    if (table->RowFlags & ImGuiTableRowFlags_Headers)
    {
        TableSetBgColor(ImGuiTableBgTarget_RowBg0, GetColorU32(ImGuiCol_TableHeaderBg));
        if (table->CurrentRow == 0)
            table->IsUsingHeaders = true;
    }
}